

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.cpp
# Opt level: O2

bool __thiscall
axl::xml::ExpatParserRoot::parseFile(ExpatParserRoot *this,StringRef *fileName,size_t blockSize)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  Module *pMVar5;
  uint64_t uVar6;
  void *pvVar7;
  ulong size;
  SimpleMappedFile mappedFile;
  
  mappedFile.m_file.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  mappedFile.m_mapping.m_mapping.m_p = (void *)0x0;
  mappedFile.m_mapping.m_mapping.m_size = 0;
  mappedFile.m_mapping.m_sharedMemory.super_File.
  super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (File)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  mappedFile.m_mapping.m_sharedMemoryName.
  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  mappedFile.m_mapping.m_sharedMemoryName.
  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr._0_1_ = 0;
  mappedFile.m_mapping.m_sharedMemoryName.
  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr._1_7_ = 0;
  mappedFile.m_mapping.m_sharedMemoryName.
  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length._0_1_ = 0;
  mappedFile.m_mapping.m_sharedMemoryName.
  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>._17_8_ = 0;
  mappedFile.m_mapping.m_p = (void *)0x0;
  mappedFile.m_mapping.m_size = 0;
  mappedFile.m_openFlags = 0;
  if (blockSize + 1 < 2) {
    iVar3 = io::SimpleMappedFile::open(&mappedFile,(char *)fileName,1);
    pvVar7 = mappedFile.m_mapping.m_p;
    if ((char)iVar3 != '\0') {
      uVar4 = io::psx::File::getSize((File *)&mappedFile);
      bVar2 = parse(this,pvVar7,uVar4,true);
      goto LAB_0012607a;
    }
  }
  else {
    pMVar5 = g::getModule();
    sVar1 = (pMVar5->m_systemInfo).m_mappingAlignFactor;
    iVar3 = io::SimpleMappedFile::open(&mappedFile,(char *)fileName,0,0,1);
    if ((char)iVar3 != '\0') {
      uVar6 = io::psx::File::getSize((File *)&mappedFile);
      size = -sVar1 & (blockSize + sVar1) - 1;
      uVar4 = 0;
      while (uVar4 + size < uVar6) {
        pvVar7 = io::SimpleMappedFile::view(&mappedFile,uVar4,size);
        if ((pvVar7 == (void *)0x0) ||
           (bVar2 = parse(this,pvVar7,size,false), uVar4 = uVar4 + size, !bVar2)) goto LAB_00126078;
      }
      pvVar7 = io::SimpleMappedFile::view(&mappedFile,uVar4,uVar6 - uVar4);
      if (pvVar7 != (void *)0x0) {
        bVar2 = parse(this,pvVar7,uVar6 - uVar4,true);
        goto LAB_0012607a;
      }
    }
  }
LAB_00126078:
  bVar2 = false;
LAB_0012607a:
  io::SimpleMappedFile::~SimpleMappedFile(&mappedFile);
  return bVar2;
}

Assistant:

bool
ExpatParserRoot::parseFile(
	const sl::StringRef& fileName,
	size_t blockSize
) {
	bool result;

	io::SimpleMappedFile mappedFile;

	if (!blockSize || blockSize == -1) {
		return
			mappedFile.open(fileName, io::FileFlag_ReadOnly) &&
			parse(mappedFile.p(), (size_t)mappedFile.getFileSize(), true);
	}

	// round-up block size

	size_t alignFactor = g::getModule()->getSystemInfo()->m_mappingAlignFactor;
	blockSize = (blockSize + alignFactor - 1) & ~(alignFactor - 1);

	result = mappedFile.open(fileName, 0, 0, io::FileFlag_ReadOnly);
	if (!result)
		return false;

	void* p;
	uint64_t offset = 0;
	uint64_t size = mappedFile.getFileSize();

	while (offset + blockSize < size) {
		result =
			(p = mappedFile.view(offset, blockSize)) &&
			parse(p, blockSize, false);

		if (!result)
			return false;

		offset += blockSize;
	}

	// final block

	blockSize = (size_t)(size - offset);

	return
		(p = mappedFile.view(offset, blockSize)) &&
		parse(p, blockSize, true);
}